

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_StrCmp(char **pp1,char **pp2)

{
  char cVar1;
  char *p1;
  long lVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  
  p1 = *pp1;
  lVar5 = 0;
  cVar3 = *p1;
  while (((cVar3 != '\0' && (cVar1 = (*pp2)[lVar5], cVar1 != '\0')) && (cVar3 == cVar1))) {
    lVar2 = lVar5 + 1;
    lVar5 = lVar5 + 1;
    cVar3 = p1[lVar2];
  }
  iVar4 = Cba_StrCmpInt(p1,*pp2,(int)lVar5);
  return iVar4;
}

Assistant:

int Cba_StrCmp( char ** pp1, char ** pp2 )
{
    char * p1 = *pp1;
    char * p2 = *pp2; int i;
    for ( i = 0; p1[i] && p2[i]; i++ )
        if ( p1[i] != p2[i] )
            return Cba_StrCmpInt( p1, p2, i );
    assert( !p1[i] || !p2[i] );
    return Cba_StrCmpInt( p1, p2, i );
}